

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::TestGroupStats::~TestGroupStats(TestGroupStats *this)

{
  pointer pcVar1;
  
  this->_vptr_TestGroupStats = (_func_int **)&PTR__TestGroupStats_00192e00;
  pcVar1 = (this->groupInfo).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == &(this->groupInfo).name.field_2) {
    return;
  }
  operator_delete(pcVar1);
  return;
}

Assistant:

TestGroupStats::~TestGroupStats() = default;